

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  path local_c8;
  logger app_logs;
  
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_c8,(char (*) [7])"./logs",auto_format);
  logger::logger(&app_logs,&local_c8);
  std::filesystem::__cxx11::path::~path(&local_c8);
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((signals *)&local_c8,(char (*) [13])"warnings.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 0;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((signals *)&local_c8,(char (*) [11])"errors.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 3;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 1;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[24]>
            ((signals *)&local_c8,(char (*) [24])"application has started");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[9]>
            ((signals *)&local_c8,(char (*) [9])"info.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[13]>
            ((signals *)&local_c8,(char (*) [13])"warnings.log");
  local_c8._M_pathname._M_dataplus._M_p._0_4_ = 2;
  handlebars::dispatcher<signals,std::__cxx11::string_const&>::push_event<char_const(&)[11]>
            ((signals *)&local_c8,(char (*) [11])"errors.log");
  std::operator<<((ostream *)&std::cout,"Enter a newline to execute pending operations:\n");
  std::istream::get();
  handlebars::
  dispatcher<signals,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::respond(0);
  logger::~logger(&app_logs);
  return 0;
}

Assistant:

int
main()
{
  logger app_logs("./logs");
  app_logs.push_event(signals::open, "info.log");
  app_logs.push_event(signals::open, "warnings.log");
  app_logs.push_event(signals::open, "errors.log");
  app_logs.push_event(signals::select, "info.log");
  app_logs.push_event(signals::write, "application has started");
  app_logs.push_event(signals::close, "info.log");
  app_logs.push_event(signals::close, "warnings.log");
  app_logs.push_event(signals::close, "errors.log");

  std::cout << "Enter a newline to execute pending operations:\n";
  std::cin.get();

  app_logs.respond();
  return 0;
}